

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Block::Clear(Block *this)

{
  uint32_t cached_has_bits;
  Block *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::Clear
            (&this->inputs_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::Clear
            (&this->operations_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Block_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::Clear(&this->attributes_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Block::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Block)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  inputs_.Clear();
  outputs_.Clear();
  operations_.Clear();
  attributes_.Clear();
  _internal_metadata_.Clear<std::string>();
}